

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_UnknownExtensionsReflection_Test::
~UnknownFieldSetTest_UnknownExtensionsReflection_Test
          (UnknownFieldSetTest_UnknownExtensionsReflection_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_UnknownFieldSetTest).super_Test._vptr_Test =
       (_func_int **)&PTR__UnknownFieldSetTest_018c30f0;
  protobuf::internal::ZeroFieldsBase::~ZeroFieldsBase
            (&(this->super_UnknownFieldSetTest).empty_message_.super_ZeroFieldsBase);
  pcVar2 = (this->super_UnknownFieldSetTest).all_fields_data_._M_dataplus._M_p;
  paVar1 = &(this->super_UnknownFieldSetTest).all_fields_data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes(&(this->super_UnknownFieldSetTest).all_fields_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x398);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, UnknownExtensionsReflection) {
  // Same as UnknownExtensions except parsing via reflection.

  unittest::TestEmptyMessageWithExtensions message;
  io::ArrayInputStream raw_input(all_fields_data_.data(),
                                 all_fields_data_.size());
  io::CodedInputStream input(&raw_input);
  ASSERT_TRUE(WireFormat::ParseAndMergePartial(&input, &message));

  EXPECT_EQ(message.DebugString(), empty_message_.DebugString());
}